

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_stricmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  nk_int d;
  nk_int c2;
  nk_int c1;
  char *s2_local;
  char *s1_local;
  
  s2_local = s2;
  s1_local = s1;
  while( true ) {
    iVar1 = (int)*s1_local;
    iVar2 = (int)*s2_local;
    d = iVar1 - iVar2;
    if (((d != 0) && (((0x5a < iVar1 || (iVar1 < 0x41)) || (d = d + 0x20, d != 0)))) &&
       (((0x5a < iVar2 || (iVar2 < 0x41)) || (d = d + -0x20, d != 0)))) break;
    s2_local = s2_local + 1;
    s1_local = s1_local + 1;
    if (iVar1 == 0) {
      return 0;
    }
  }
  return (uint)(-1 < d) * 2 + -1;
}

Assistant:

NK_API int
nk_stricmp(const char *s1, const char *s2)
{
    nk_int c1,c2,d;
    do {
        c1 = *s1++;
        c2 = *s2++;
        d = c1 - c2;
        while (d) {
            if (c1 <= 'Z' && c1 >= 'A') {
                d += ('a' - 'A');
                if (!d) break;
            }
            if (c2 <= 'Z' && c2 >= 'A') {
                d -= ('a' - 'A');
                if (!d) break;
            }
            return ((d >= 0) << 1) - 1;
        }
    } while (c1);
    return 0;
}